

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

void __thiscall ON_Extrusion::Dump(ON_Extrusion *this,ON_TextLog *text_log)

{
  ON_Curve *pOVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint local_40;
  
  ON_TextLog::Print(text_log,"ON_Extrusion: \n");
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::Print(text_log,"Path: ");
  dVar2 = ON_Interval::operator[](&this->m_t,0);
  ON_Line::PointAt(&local_40,&this->m_path,dVar2);
  ON_TextLog::Print(text_log,&local_40);
  ON_TextLog::Print(text_log," ");
  dVar2 = ON_Interval::operator[](&this->m_t,1);
  ON_Line::PointAt(&local_40,&this->m_path,dVar2);
  ON_TextLog::Print(text_log,&local_40);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"Up: ");
  ON_TextLog::Print(text_log,&this->m_up);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"m_bCap[] = (%d, %d)\n",(ulong)this->m_bCap[0],(ulong)this->m_bCap[1]);
  ON_TextLog::Print(text_log,"m_bHaveN[] = (%d, %d)\n",(ulong)this->m_bHaveN[0],
                    (ulong)this->m_bHaveN[1]);
  ON_TextLog::Print(text_log,"m_N[] = (");
  ON_TextLog::Print(text_log,this->m_N);
  ON_TextLog::Print(text_log,", ");
  ON_TextLog::Print(text_log,this->m_N + 1);
  ON_TextLog::Print(text_log,"\n");
  dVar2 = ON_Interval::operator[](&this->m_path_domain,0);
  dVar3 = ON_Interval::operator[](&this->m_path_domain,1);
  ON_TextLog::Print(text_log,"m_path_domain = (%.17g, %.17g)\n",dVar2,SUB84(dVar3,0));
  ON_TextLog::Print(text_log,"m_bTransposed = %d\n",(ulong)this->m_bTransposed);
  ON_TextLog::Print(text_log,"Profile Count: %d\n",(ulong)(uint)this->m_profile_count);
  ON_TextLog::Print(text_log,"Profile:\n");
  ON_TextLog::PushIndent(text_log);
  pOVar1 = this->m_profile;
  if (pOVar1 == (ON_Curve *)0x0) {
    ON_TextLog::Print(text_log,"nullptr");
  }
  else {
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])(pOVar1,text_log);
  }
  ON_TextLog::PopIndent(text_log);
  ON_MeshCache::Dump(&this->m_mesh_cache,text_log);
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_Extrusion::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("ON_Extrusion: \n");
  {
    text_log.PushIndent();
    text_log.Print("Path: ");
    text_log.Print(m_path.PointAt(m_t[0]));
    text_log.Print(" ");
    text_log.Print(m_path.PointAt(m_t[1]));
    text_log.Print("\n");
    text_log.Print("Up: ");
    text_log.Print(m_up);
    text_log.Print("\n");
    text_log.Print("m_bCap[] = (%d, %d)\n",m_bCap[0],m_bCap[1]);
    text_log.Print("m_bHaveN[] = (%d, %d)\n",m_bHaveN[0],m_bHaveN[1]);
    text_log.Print("m_N[] = (");
    text_log.Print(m_N[0]);
    text_log.Print(", ");
    text_log.Print(m_N[1]);
    text_log.Print("\n");
    text_log.Print("m_path_domain = (%.17g, %.17g)\n",m_path_domain[0],m_path_domain[1]);
    text_log.Print("m_bTransposed = %d\n",m_bTransposed);
    text_log.Print("Profile Count: %d\n",m_profile_count);
    text_log.Print("Profile:\n");
    {
      text_log.PushIndent();
      if ( !m_profile )
        text_log.Print("nullptr");
      else
        m_profile->Dump(text_log);
      text_log.PopIndent();
    }

    m_mesh_cache.Dump(text_log);

    text_log.PopIndent();
  }

  return;
}